

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

OneWayPipe * __thiscall
kj::anon_unknown_30::AsyncIoProviderImpl::newOneWayPipe
          (OneWayPipe *__return_storage_ptr__,AsyncIoProviderImpl *this)

{
  int iVar1;
  int fds [2];
  Fault f;
  
  do {
    iVar1 = pipe2(fds,0x80800);
    if (-1 < iVar1) goto LAB_00493620;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x5e3,iVar1,"pipe2(fds, O_NONBLOCK | O_CLOEXEC)","");
    kj::_::Debug::Fault::fatal(&f);
  }
LAB_00493620:
  (**this->lowLevel->_vptr_LowLevelAsyncIoProvider)
            (__return_storage_ptr__,this->lowLevel,(ulong)(uint)fds[0],7);
  (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[1])
            (&__return_storage_ptr__->out,this->lowLevel,(ulong)(uint)fds[1],7);
  return __return_storage_ptr__;
}

Assistant:

OneWayPipe newOneWayPipe() override {
    int fds[2];
#if __linux__ && !__BIONIC__
    KJ_SYSCALL(pipe2(fds, O_NONBLOCK | O_CLOEXEC));
#else
    KJ_SYSCALL(pipe(fds));
#endif
    return OneWayPipe {
      lowLevel.wrapInputFd(fds[0], NEW_FD_FLAGS),
      lowLevel.wrapOutputFd(fds[1], NEW_FD_FLAGS)
    };
  }